

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O1

bool P_GiveBody(AActor *actor,int num,int max)

{
  uint uVar1;
  player_t *ppVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  
  if (actor->health < 1) {
    return false;
  }
  ppVar2 = actor->player;
  if ((ppVar2 != (player_t *)0x0) && (ppVar2->playerstate == '\x01')) {
    return false;
  }
  iVar3 = 0x10000;
  if (num < 0x10000) {
    iVar3 = num;
  }
  iVar5 = -0x10000;
  if (-0x10000 < iVar3) {
    iVar5 = iVar3;
  }
  if (ppVar2 == (player_t *)0x0) {
    iVar3 = AActor::SpawnHealth(actor);
    if (num < 0) {
      iVar4 = -(iVar5 * iVar3) / 100;
      if (iVar4 <= actor->health) {
        return false;
      }
    }
    else {
      if (iVar3 <= actor->health) {
        return false;
      }
      iVar4 = actor->health + iVar5;
      if (iVar3 <= iVar4) {
        iVar4 = iVar3;
      }
    }
  }
  else {
    if (max < 1) {
      iVar4 = APlayerPawn::GetMaxHealth((APlayerPawn *)actor);
      iVar3 = (ppVar2->mo->super_AActor).stamina;
      max = iVar3 + iVar4;
      if (ppVar2->morphTics != 0) {
        uVar1 = ppVar2->MorphStyle;
        if ((uVar1 & 2) == 0) {
          max = 0x1e;
          if ((uVar1 & 1) != 0) {
            max = iVar3 + 0x1e;
          }
        }
        else if ((uVar1 & 1) == 0) {
          max = iVar4;
        }
      }
    }
    if (num < 0) {
      iVar4 = -(iVar5 * max) / 100;
      if (iVar4 <= ppVar2->health) {
        return false;
      }
    }
    else {
      if ((num == 0) || (max <= ppVar2->health)) {
        return false;
      }
      dVar6 = G_SkillProperty(SKILLP_HealthFactor);
      iVar4 = 1;
      if (1 < (int)(dVar6 * (double)iVar5)) {
        iVar4 = (int)(dVar6 * (double)iVar5);
      }
      iVar4 = iVar4 + ppVar2->health;
      if (max <= iVar4) {
        iVar4 = max;
      }
    }
    ppVar2->health = iVar4;
  }
  actor->health = iVar4;
  return true;
}

Assistant:

bool P_GiveBody (AActor *actor, int num, int max)
{
	if (actor->health <= 0 || (actor->player != NULL && actor->player->playerstate == PST_DEAD))
	{ // Do not heal dead things.
		return false;
	}

	player_t *player = actor->player;

	num = clamp(num, -65536, 65536);	// prevent overflows for bad values
	if (player != NULL)
	{
		// Max is 0 by default, preserving default behavior for P_GiveBody()
		// calls while supporting AHealth.
		if (max <= 0)
		{
			max = static_cast<APlayerPawn*>(actor)->GetMaxHealth() + player->mo->stamina;
			// [MH] First step in predictable generic morph effects
 			if (player->morphTics)
 			{
				if (player->MorphStyle & MORPH_FULLHEALTH)
				{
					if (!(player->MorphStyle & MORPH_ADDSTAMINA))
					{
						max -= player->mo->stamina;
					}
				}
				else // old health behaviour
				{
					max = MAXMORPHHEALTH;
					if (player->MorphStyle & MORPH_ADDSTAMINA)
					{
						max += player->mo->stamina;
					}
				}
 			}
		}
		// [RH] For Strife: A negative body sets you up with a percentage
		// of your full health.
		if (num < 0)
		{
			num = max * -num / 100;
			if (player->health < num)
			{
				player->health = num;
				actor->health = num;
				return true;
			}
		}
		else if (num > 0)
		{
			if (player->health < max)
			{
				num = int(num * G_SkillProperty(SKILLP_HealthFactor));
				if (num < 1) num = 1;
				player->health += num;
				if (player->health > max)
				{
					player->health = max;
				}
				actor->health = player->health;
				return true;
			}
		}
	}
	else
	{
		// Parameter value for max is ignored on monsters, preserving original
		// behaviour on AHealth as well as on existing calls to P_GiveBody().
		max = actor->SpawnHealth();
		if (num < 0)
		{
			num = max * -num / 100;
			if (actor->health < num)
			{
				actor->health = num;
				return true;
			}
		}
		else if (actor->health < max)
		{
			actor->health += num;
			if (actor->health > max)
			{
				actor->health = max;
			}
			return true;
		}
	}
	return false;
}